

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_35::InMemoryDirectory::EntryImpl::init(EntryImpl *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  undefined8 *in_RDX;
  Own<const_kj::Directory> *result;
  char *local_28;
  long *local_20;
  
  if (*(int *)(ctx + 0x18) != 0) {
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               *)(ctx + 0x18));
  }
  *(undefined8 *)(ctx + 0x20) = *in_RDX;
  *(undefined8 *)(ctx + 0x28) = in_RDX[1];
  in_RDX[1] = 0;
  *(undefined4 *)(ctx + 0x18) = 2;
  (**(code **)(**(long **)(ctx + 0x28) + 0x28))(&local_28);
  (this->name).content.ptr = (char *)0x0;
  (this->name).content.size_ = 0;
  if (local_20 != (long *)0x0) {
    (this->name).content.size_ = (size_t)local_20;
    (this->name).content.ptr = local_28;
    local_20 = (long *)0x0;
  }
  plVar1 = local_20;
  if (local_20 != (long *)0x0) {
    local_20 = (long *)0x0;
    (*(code *)**(undefined8 **)local_28)(local_28,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return (int)this;
}

Assistant:

Own<const Directory> init(DirectoryNode&& value) {
      return node.init<DirectoryNode>(kj::mv(value)).directory->clone();
    }